

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  sqlite3 *psVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ushort *puVar9;
  byte *pbVar10;
  byte *pbVar11;
  ushort *puVar12;
  uint uVar13;
  undefined7 in_register_00000031;
  u64 n;
  byte *pbVar14;
  long lVar15;
  ushort *puVar16;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) != 1) && (pMem->enc != '\x01')) {
    iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar6 == 0) {
      uVar8 = (long)pMem->n & 0xfffffffffffffffe;
      if (0 < (int)uVar8) {
        puVar12 = (ushort *)pMem->z;
        puVar9 = (ushort *)(uVar8 + (long)puVar12);
        do {
          *puVar12 = *puVar12 << 8 | *puVar12 >> 8;
          puVar12 = puVar12 + 1;
        } while (puVar12 < puVar9);
      }
      pMem->enc = desiredEnc;
      return 0;
    }
    return 7;
  }
  iVar6 = pMem->n;
  uVar8 = (ulong)iVar6;
  if (desiredEnc == '\x01') {
    uVar8 = uVar8 & 0xfffffffffffffffe;
    iVar6 = (int)uVar8;
    pMem->n = iVar6;
    n = uVar8 * 2 + 1;
  }
  else {
    n = uVar8 * 2 + 2;
  }
  puVar12 = (ushort *)pMem->z;
  if (pMem->db == (sqlite3 *)0x0) {
    pbVar10 = (byte *)sqlite3Malloc(n);
  }
  else {
    pbVar10 = (byte *)sqlite3DbMallocRawNN(pMem->db,n);
  }
  if (pbVar10 == (byte *)0x0) {
    return 7;
  }
  puVar9 = (ushort *)(uVar8 + (long)puVar12);
  if (pMem->enc == '\x01') {
    pbVar11 = pbVar10;
    if (desiredEnc == '\x02') {
      if (0 < iVar6) {
        do {
          bVar2 = (byte)*puVar12;
          puVar16 = (ushort *)((long)puVar12 + 1);
          puVar12 = puVar16;
          uVar7 = (uint)bVar2;
          if (bVar2 < 0xc0) {
LAB_00155c09:
            *(short *)pbVar11 = (short)uVar7;
            pbVar11 = pbVar11 + 2;
          }
          else {
            uVar13 = (uint)""[bVar2 - 0xc0];
            while ((puVar12 = puVar9, puVar16 != puVar9 &&
                   (uVar3 = *puVar16, puVar12 = puVar16, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
              puVar16 = (ushort *)((long)puVar16 + 1);
              uVar13 = (byte)uVar3 & 0x3f | uVar13 << 6;
            }
            uVar7 = 0xfffd;
            if ((((uVar13 & 0xfffffffe) == 0xfffe) || (uVar13 < 0x80)) ||
               (((uVar13 & 0xfffff800) == 0xd800 || (uVar7 = uVar13, uVar13 < 0x10000))))
            goto LAB_00155c09;
            *pbVar11 = (byte)(uVar13 - 0x10000 >> 10) & 0xc0 | (byte)(uVar13 >> 10) & 0x3f;
            pbVar11[1] = (byte)(uVar13 - 0x10000 >> 0x12) & 3 | 0xd8;
            pbVar11[2] = (byte)uVar13;
            pbVar11[3] = (byte)(uVar13 >> 8) & 3 | 0xdc;
            pbVar11 = pbVar11 + 4;
          }
        } while (puVar12 < puVar9);
      }
    }
    else if (0 < iVar6) {
      do {
        bVar2 = (byte)*puVar12;
        puVar16 = (ushort *)((long)puVar12 + 1);
        puVar12 = puVar16;
        uVar7 = (uint)bVar2;
        if (bVar2 < 0xc0) {
LAB_00155e0f:
          uVar13 = uVar7;
          pbVar14 = pbVar11 + 1;
          *pbVar11 = (byte)(uVar13 >> 8);
          lVar15 = 2;
        }
        else {
          uVar13 = (uint)""[bVar2 - 0xc0];
          while ((puVar12 = puVar9, puVar16 != puVar9 &&
                 (uVar3 = *puVar16, puVar12 = puVar16, ((byte)uVar3 & 0xffffffc0) == 0x80))) {
            puVar16 = (ushort *)((long)puVar16 + 1);
            uVar13 = (byte)uVar3 & 0x3f | uVar13 << 6;
          }
          uVar7 = 0xfffd;
          if (((((uVar13 & 0xfffffffe) == 0xfffe) || (uVar13 < 0x80)) ||
              ((uVar13 & 0xfffff800) == 0xd800)) || (uVar7 = uVar13, uVar13 < 0x10000))
          goto LAB_00155e0f;
          *pbVar11 = (byte)(uVar13 - 0x10000 >> 0x12) & 3 | 0xd8;
          pbVar11[1] = (byte)(uVar13 - 0x10000 >> 10) & 0xc0 | (byte)(uVar13 >> 10) & 0x3f;
          pbVar14 = pbVar11 + 3;
          pbVar11[2] = (byte)(uVar13 >> 8) & 3 | 0xdc;
          lVar15 = 4;
        }
        pbVar11 = pbVar11 + lVar15;
        *pbVar14 = (byte)uVar13;
      } while (puVar12 < puVar9);
    }
    pMem->n = (int)pbVar11 - (int)pbVar10;
    *pbVar11 = 0;
    pbVar11 = pbVar11 + 1;
  }
  else {
    pbVar11 = pbVar10;
    if (pMem->enc == '\x02') {
      if (0 < iVar6) {
        do {
          bVar2 = (byte)*puVar12;
          puVar16 = puVar12 + 1;
          bVar1 = *(byte *)((long)puVar12 + 1);
          uVar3 = *puVar12;
          if (((bVar1 & 0xf8) == 0xd8) && (puVar16 < puVar9)) {
            uVar5 = puVar12[1];
            bVar1 = *(byte *)((long)puVar12 + 3);
            puVar16 = puVar12 + 2;
            iVar6 = (uVar3 & 0x3c0) * 0x400;
            *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
            pbVar11[1] = (byte)(iVar6 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80
            ;
            pbVar11[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar5 | (uint)bVar2 << 10) >> 6) &
                         0x3f | 0x80;
            pbVar11[3] = (byte)uVar5 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 4;
          }
          else if (uVar3 < 0x80) {
            *pbVar11 = bVar2;
            pbVar11 = pbVar11 + 1;
          }
          else if (bVar1 < 8) {
            *pbVar11 = (byte)(uVar3 >> 6) | 0xc0;
            pbVar11[1] = bVar2 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 2;
          }
          else {
            *pbVar11 = bVar1 >> 4 | 0xe0;
            pbVar11[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
            pbVar11[2] = bVar2 & 0x3f | 0x80;
            pbVar11 = pbVar11 + 3;
          }
          puVar12 = puVar16;
        } while (puVar16 < puVar9);
      }
    }
    else if (0 < iVar6) {
      do {
        bVar2 = (byte)*puVar12;
        puVar16 = puVar12 + 1;
        bVar1 = *(byte *)((long)puVar12 + 1);
        uVar3 = CONCAT11(bVar2,bVar1);
        if (((bVar2 & 0xf8) == 0xd8) && (puVar16 < puVar9)) {
          uVar5 = puVar12[1];
          bVar2 = *(byte *)((long)puVar12 + 3);
          puVar16 = puVar12 + 2;
          iVar6 = (uVar3 & 0x3c0) * 0x400;
          *pbVar11 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
          pbVar11[1] = (byte)(iVar6 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f | 0x80;
          pbVar11[2] = (byte)((((byte)uVar5 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6) &
                       0x3f | 0x80;
          pbVar11[3] = bVar2 & 0x3f | 0x80;
          pbVar11 = pbVar11 + 4;
        }
        else if (uVar3 < 0x80) {
          *pbVar11 = bVar1;
          pbVar11 = pbVar11 + 1;
        }
        else if (bVar2 < 8) {
          *pbVar11 = (byte)(uVar3 >> 6) | 0xc0;
          pbVar11[1] = bVar1 & 0x3f | 0x80;
          pbVar11 = pbVar11 + 2;
        }
        else {
          *pbVar11 = bVar2 >> 4 | 0xe0;
          pbVar11[1] = (byte)(uVar3 >> 6) & 0x3f | 0x80;
          pbVar11[2] = bVar1 & 0x3f | 0x80;
          pbVar11 = pbVar11 + 3;
        }
        puVar12 = puVar16;
      } while (puVar16 < puVar9);
    }
    pMem->n = (int)pbVar11 - (int)pbVar10;
  }
  *pbVar11 = 0;
  uVar3 = pMem->flags;
  if (((uVar3 & 0x9000) != 0) || (pMem->szMalloc != 0)) {
    vdbeMemClear(pMem);
  }
  pMem->flags = uVar3 & 0x83d | 0x202;
  pMem->enc = desiredEnc;
  pMem->z = (char *)pbVar10;
  pMem->zMalloc = (char *)pbVar10;
  psVar4 = pMem->db;
  if ((psVar4 != (sqlite3 *)0x0) && (pbVar10 < (psVar4->lookaside).pTrueEnd)) {
    uVar7 = 0x80;
    if ((psVar4->lookaside).pMiddle <= pbVar10) goto LAB_00155ef1;
    if ((psVar4->lookaside).pStart <= pbVar10) {
      uVar7 = (uint)(psVar4->lookaside).szTrue;
      goto LAB_00155ef1;
    }
  }
  uVar7 = (*sqlite3Config.m.xSize)(pbVar10);
LAB_00155ef1:
  pMem->szMalloc = uVar7;
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  sqlite3_int64 len;          /* Maximum length of output string in bytes */
  unsigned char *zOut;        /* Output buffer */
  unsigned char *zIn;         /* Input iterator */
  unsigned char *zTerm;       /* End of input */
  unsigned char *z;           /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    StrAccum acc;
    char zBuf[1000];
    sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
    sqlite3VdbeMemPrettyPrint(pMem, &acc);
    fprintf(stderr, "INPUT:  %s\n", sqlite3StrAccumFinish(&acc));
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = 2 * (sqlite3_int64)pMem->n + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = 2 * (sqlite3_int64)pMem->n + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        c = *(zIn++);
        c += (*(zIn++))<<8;
        if( c>=0xd800 && c<0xe000 ){
#ifdef SQLITE_REPLACE_INVALID_UTF
          if( c>=0xdc00 || zIn>=zTerm ){
            c = 0xfffd;
          }else{
            int c2 = *(zIn++);
            c2 += (*(zIn++))<<8;
            if( c2<0xdc00 || c2>=0xe000 ){
              zIn -= 2;
              c = 0xfffd;
            }else{
              c = ((c&0x3ff)<<10) + (c2&0x3ff) + 0x10000;
            }
          }
#else
          if( zIn<zTerm ){
            int c2 = (*zIn++);
            c2 += ((*zIn++)<<8);
            c = (c2&0x03FF) + ((c&0x003F)<<10) + (((c&0x03C0)+0x0040)<<10);
          }
#endif
        }
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        c = (*(zIn++))<<8;
        c += *(zIn++);
        if( c>=0xd800 && c<0xe000 ){
#ifdef SQLITE_REPLACE_INVALID_UTF
          if( c>=0xdc00 || zIn>=zTerm ){
            c = 0xfffd;
          }else{
            int c2 = (*(zIn++))<<8;
            c2 += *(zIn++);
            if( c2<0xdc00 || c2>=0xe000 ){
              zIn -= 2;
              c = 0xfffd;
            }else{
              c = ((c&0x3ff)<<10) + (c2&0x3ff) + 0x10000;
            }
          }
#else
          if( zIn<zTerm ){
            int c2 = ((*zIn++)<<8);
            c2 += (*zIn++);
            c = (c2&0x03FF) + ((c&0x003F)<<10) + (((c&0x03C0)+0x0040)<<10);
          }
#endif
        }
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = MEM_Str|MEM_Term|(pMem->flags&(MEM_AffMask|MEM_Subtype));
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = c;
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    StrAccum acc;
    char zBuf[1000];
    sqlite3StrAccumInit(&acc, 0, zBuf, sizeof(zBuf), 0);
    sqlite3VdbeMemPrettyPrint(pMem, &acc);
    fprintf(stderr, "OUTPUT: %s\n", sqlite3StrAccumFinish(&acc));
  }
#endif
  return SQLITE_OK;
}